

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

void __thiscall
CVmByteArraySource::CVmByteArraySource
          (CVmByteArraySource *this,vm_obj_id_t arr,long start_idx,long len)

{
  CVmObjPageEntry *pCVar1;
  ulong uVar2;
  ulong uVar3;
  
  (this->super_CVmDataSource)._vptr_CVmDataSource = (_func_int **)&PTR__CVmDataSource_00317798;
  this->vmg = (vm_globals *)0x0;
  this->arr_id = arr;
  pCVar1 = G_obj_table_X.pages_[arr >> 0xc];
  this->arr = (CVmObjByteArray *)(pCVar1 + (arr & 0xfff));
  this->idx = start_idx;
  this->start_idx = start_idx;
  uVar3 = len + start_idx;
  this->end_idx = uVar3;
  uVar2 = (ulong)**(uint **)((long)&pCVar1[arr & 0xfff].ptr_ + 8);
  if (uVar2 <= uVar3) {
    uVar3 = uVar2;
  }
  this->end_idx = uVar3;
  return;
}

Assistant:

CVmByteArraySource(VMG_ vm_obj_id_t arr, long start_idx, long len)
    {
        /* remember the array and globals */
        this->vmg = VMGLOB_ADDR;
        this->arr_id = arr;
        this->arr = (CVmObjByteArray *)vm_objp(vmg_ arr);

        /* remember our window */
        this->idx = start_idx;
        this->start_idx = start_idx;
        this->end_idx = start_idx + len;

        /* limit the window to the actual available size */
        if ((unsigned long)end_idx > this->arr->get_element_count())
            end_idx = this->arr->get_element_count();
    }